

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdShift<long,long>(Thread *this,BinopFunc<long,_long> *f)

{
  long lVar1;
  long lVar2;
  Simd<long,_(unsigned_char)__x02_> SVar3;
  byte local_41;
  long lStack_40;
  u8 i;
  SR result;
  Simd<long,_(unsigned_char)__x02_> lhs;
  long amount;
  BinopFunc<long,_long> *f_local;
  Thread *this_local;
  
  lVar1 = Pop<long>(this);
  SVar3 = Pop<wabt::interp::Simd<long,(unsigned_char)2>>(this);
  result.v[1] = SVar3.v[0];
  lhs.v[0] = SVar3.v[1];
  for (local_41 = 0; local_41 < 2; local_41 = local_41 + 1) {
    lVar2 = (*f)(result.v[(ulong)local_41 + 1],lVar1);
    lhs.v[(ulong)local_41 - 3] = lVar2;
  }
  SVar3.v[1] = result.v[0];
  SVar3.v[0] = lStack_40;
  Push<wabt::interp::Simd<long,(unsigned_char)2>>(this,SVar3);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<T>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result.v[i] = f(lhs.v[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}